

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O1

string * LatencyDumpDefaultImpl::getActualFunction
                   (string *__return_storage_ptr__,string *str,bool add_tab)

{
  pointer pcVar1;
  size_t sVar2;
  long lVar3;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  sVar2 = getNumStacks(str);
  if (sVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  }
  else {
    std::__cxx11::string::rfind((char *)str,0x10a1aa,0xffffffffffffffff);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    if (add_tab && sVar2 != 1) {
      lVar3 = sVar2 - 1;
      do {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)str);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getActualFunction(const std::string& str,
                                         bool add_tab = true) {
        size_t level = getNumStacks(str);
        if (!level) {
            return str;
        }

        size_t pos = str.rfind(" ## ");
        std::string ret = "";
        if (level > 1 && add_tab) {
            for (size_t i=1; i<level; ++i) {
                ret += "  ";
            }
        }
        ret += str.substr(pos + 4);
        return ret;
    }